

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<signed_char,std::allocator<signed_char>>,void>
               (vector<signed_char,_std::allocator<signed_char>_> *container,ostream *os)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pcVar2 = (container->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (container->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar2 != pcVar3) {
    lVar4 = 0;
    do {
      if ((lVar4 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar4 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_001ccaed;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      pcVar1 = pcVar2 + lVar4;
      testing::internal::PrintTo((int)*pcVar1,os);
      lVar4 = lVar4 + 1;
    } while (pcVar1 + 1 != pcVar3);
    if (pcVar3 != pcVar2) {
LAB_001ccaed:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }